

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCanon.c
# Opt level: O0

uint Map_CanonComputePhase(uint (*uTruths) [2],int nVars,uint uTruth,uint uPhase)

{
  uint local_24;
  int local_20;
  int Shift;
  int v;
  uint uPhase_local;
  uint uTruth_local;
  int nVars_local;
  uint (*uTruths_local) [2];
  
  local_24 = 1;
  v = uTruth;
  for (local_20 = 0; local_20 < nVars; local_20 = local_20 + 1) {
    if ((uPhase & local_24) != 0) {
      v = (v & (uTruths[local_20][0] ^ 0xffffffff)) << ((byte)local_24 & 0x1f) |
          (v & uTruths[local_20][0]) >> ((byte)local_24 & 0x1f);
    }
    local_24 = local_24 << 1;
  }
  return v;
}

Assistant:

unsigned Map_CanonComputePhase( unsigned uTruths[][2], int nVars, unsigned uTruth, unsigned uPhase )
{
    int v, Shift;
    for ( v = 0, Shift = 1; v < nVars; v++, Shift <<= 1 )
        if ( uPhase & Shift )
            uTruth = (((uTruth & ~uTruths[v][0]) << Shift) | ((uTruth & uTruths[v][0]) >> Shift));
    return uTruth;
}